

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O1

void __thiscall
iu_UnitStringTest_x_iutest_x_Wcsicmp_Test::Body(iu_UnitStringTest_x_iutest_x_Wcsicmp_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *in_R9;
  AssertionResult iutest_ar;
  int *in_stack_fffffffffffffe08;
  AssertionResult local_1f0;
  AssertionHelper local_1c8;
  undefined1 local_198 [392];
  
  local_198._0_4_ = 0;
  local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
       wcscasecmp(L"AAA",L"aaa");
  iutest::internal::CmpHelperEQ<int,int>
            (&local_1f0,(internal *)0x171a14,"::iutest::detail::iu_wcsicmp(L\"AAA\", L\"aaa\")",
             local_198,(int *)&local_1c8,in_R9);
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffe0f);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x36;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (int)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (int)local_1c8.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p),
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  paVar1 = &local_1f0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    CONCAT71(local_1f0.m_message.field_2._M_allocated_capacity._1_7_,
                             local_1f0.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_198._0_4_ = 0;
  local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
       wcscasecmp(L"AAAa",L"aaa");
  if ((int)local_198._0_4_ <
      (int)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) {
    local_1f0.m_message._M_string_length = 0;
    local_1f0.m_message.field_2._M_local_buf[0] = '\0';
    local_1f0.m_result = true;
    local_1f0.m_message._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_1f0,(internal *)0x171a14,"::iutest::detail::iu_wcsicmp(L\"AAAa\", L\"aaa\")",
               "<",local_198,(int *)&local_1c8,in_stack_fffffffffffffe08);
  }
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffe0f);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x37;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (int)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (int)local_1c8.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p),
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    CONCAT71(local_1f0.m_message.field_2._M_allocated_capacity._1_7_,
                             local_1f0.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_198._0_4_ = 0;
  local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
       wcscasecmp(L"AAAB",L"aaaa");
  if ((int)local_198._0_4_ <
      (int)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) {
    local_1f0.m_message._M_string_length = 0;
    local_1f0.m_message.field_2._M_local_buf[0] = '\0';
    local_1f0.m_result = true;
    local_1f0.m_message._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_1f0,(internal *)0x171a14,"::iutest::detail::iu_wcsicmp(L\"AAAB\", L\"aaaa\")",
               "<",local_198,(int *)&local_1c8,in_stack_fffffffffffffe08);
  }
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffe0f);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x38;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (int)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (int)local_1c8.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p),
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    CONCAT71(local_1f0.m_message.field_2._M_allocated_capacity._1_7_,
                             local_1f0.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_198._0_4_ = 0;
  local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
       wcscasecmp(L"AAAa",L"aaaB");
  if ((int)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p <
      (int)local_198._0_4_) {
    local_1f0.m_message._M_string_length = 0;
    local_1f0.m_message.field_2._M_local_buf[0] = '\0';
    local_1f0.m_result = true;
    local_1f0.m_message._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_1f0,(internal *)0x171a14,"::iutest::detail::iu_wcsicmp(L\"AAAa\", L\"aaaB\")",
               ">",local_198,(int *)&local_1c8,in_stack_fffffffffffffe08);
  }
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffe0f);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x39;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (int)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (int)local_1c8.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p),
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    CONCAT71(local_1f0.m_message.field_2._M_allocated_capacity._1_7_,
                             local_1f0.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_198._0_4_ = 0;
  local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
       wcscasecmp(L"AAA",L"aaaA");
  if ((int)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p <
      (int)local_198._0_4_) {
    local_1f0.m_message._M_string_length = 0;
    local_1f0.m_message.field_2._M_local_buf[0] = '\0';
    local_1f0.m_result = true;
    local_1f0.m_message._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_1f0,(internal *)0x171a14,"::iutest::detail::iu_wcsicmp(L\"AAA\", L\"aaaA\")",
               ">",local_198,(int *)&local_1c8,in_stack_fffffffffffffe08);
  }
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffe0f);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x3a;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (int)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (int)local_1c8.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p),
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    CONCAT71(local_1f0.m_message.field_2._M_allocated_capacity._1_7_,
                             local_1f0.m_message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, Wcsicmp)
{
    IUTEST_EXPECT_EQ(0, ::iutest::detail::iu_wcsicmp(L"AAA", L"aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::iu_wcsicmp(L"AAAa", L"aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::iu_wcsicmp(L"AAAB", L"aaaa"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::iu_wcsicmp(L"AAAa", L"aaaB"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::iu_wcsicmp(L"AAA", L"aaaA"));
}